

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

void startRequestHandling(int sock_fd,char *rootDoc,char *i_index)

{
  int __fd;
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  undefined8 local_1040;
  FILE *requestedFile;
  char fullPath [1024];
  char path [1024];
  char get [1024];
  char buf [1024];
  FILE *socketFile;
  int request_fd;
  char *i_index_local;
  char *rootDoc_local;
  int sock_fd_local;
  
  while( true ) {
    if (terminate != 0) {
      return;
    }
    __fd = accept(sock_fd,(sockaddr *)0x0,(socklen_t *)0x0);
    if (__fd < 0) break;
    __stream = fdopen(__fd,"r+");
    if (__stream == (FILE *)0x0) {
      fprintf(_stderr,"%s ERROR: ",fileName);
      fprintf(_stderr,"could not open socket");
      fprintf(_stderr,"\n");
    }
    else {
      get[0x3f8] = '\0';
      path[0x3f8] = '\0';
      fullPath[0x3f8] = '\0';
      requestedFile._0_1_ = 0;
      fgets(get + 0x3f8,0x400,__stream);
      __isoc99_sscanf(get + 0x3f8,"%[^ ] /%[^ ] HTTP/1.1\r\n",path + 0x3f8,fullPath + 0x3f8);
      strcat((char *)&requestedFile,rootDoc);
      strcat((char *)&requestedFile,fullPath + 0x3f8);
      sVar2 = strlen((char *)&requestedFile);
      if (*(char *)((long)&local_1040 + sVar2 + 7) == '/') {
        strcat((char *)&requestedFile,i_index);
      }
      fprintf(_stderr,"GET: %s PATH: %s\n",path + 0x3f8,&requestedFile);
      goToEndOfHeader((FILE *)__stream);
      iVar1 = strcmp(path + 0x3f8,"GET");
      if (iVar1 == 0) {
        local_1040 = fopen((char *)&requestedFile,"r+");
        if (local_1040 == (FILE *)0x0) {
          printHeader((FILE *)__stream,0x194,(FILE *)0x0);
          fflush(__stream);
          fclose(__stream);
          close(__fd);
        }
        else {
          printHeader((FILE *)__stream,200,(FILE *)local_1040);
          writeFileToFile((FILE *)local_1040,(FILE *)__stream);
          fflush(__stream);
          fclose(__stream);
          close(__fd);
          fprintf(_stderr,"finished\n");
        }
      }
      else {
        printHeader((FILE *)__stream,0x1f5,(FILE *)0x0);
        fflush(__stream);
        fclose(__stream);
        close(__fd);
      }
    }
  }
  close(__fd);
  return;
}

Assistant:

static void startRequestHandling(int sock_fd,char * rootDoc, char * i_index) {
	while (!terminate) {
		int request_fd = accept(sock_fd, NULL, NULL);

		if (request_fd < 0) {
			close(request_fd);
			break;
		}

		FILE *socketFile = fdopen(request_fd, "r+");
		if (socketFile == NULL) {
			ERROR_MSG("could not open socket");
			continue;
		}

		char buf[CHARLENGTH]; buf[0] = '\0';
		char get[CHARLENGTH]; get[0] = '\0';
		char path[CHARLENGTH]; path[0] = '\0';
		char fullPath[CHARLENGTH]; fullPath[0] = '\0';

		fgets(buf, sizeof(buf), socketFile);
		sscanf(buf, "%[^ ] /%[^ ] HTTP/1.1\r\n", get, path);
		strcat(fullPath, rootDoc);
		strcat(fullPath, path);
		if (fullPath[strlen(fullPath) - 1] == '/') {
			strcat(fullPath, i_index);
		}

		fprintf(stderr, "GET: %s PATH: %s\n", get, fullPath);

		goToEndOfHeader(socketFile);

		if (strcmp(get, "GET") != 0) {
			printHeader(socketFile, 501,NULL);
			fflush(socketFile);
			fclose(socketFile);
			close(request_fd);
			continue;
		}

		FILE* requestedFile = fopen(fullPath, "r+");
		if (requestedFile == NULL) {
			printHeader(socketFile, 404,NULL);
			fflush(socketFile);
			fclose(socketFile);
			close(request_fd);
			continue;
		}
		printHeader(socketFile,200,requestedFile);

		writeFileToFile(requestedFile,socketFile);

		fflush(socketFile);
		fclose(socketFile);
		close(request_fd);
		fprintf(stderr, "finished\n");

	}
}